

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O1

learner<ftrl,_example> *
LEARNER::init_learner<ftrl,example,LEARNER::learner<char,example>>
          (free_ptr<ftrl> *dat,_func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr *learn,
          _func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr *predict,
          size_t params_per_weight)

{
  ftrl *pfVar1;
  learner<ftrl,_example> *plVar2;
  
  pfVar1 = (dat->_M_t).super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
           _M_head_impl;
  plVar2 = calloc_or_throw<LEARNER::learner<ftrl,example>>(1);
  *(undefined8 *)(plVar2 + 0xd8) = 1;
  *(size_t *)(plVar2 + 0xe0) = params_per_weight;
  *(code **)(plVar2 + 0x98) = noop;
  *(code **)(plVar2 + 0xb0) = noop;
  *(code **)(plVar2 + 0x10) = noop;
  *(code **)(plVar2 + 0x80) = noop_sl;
  *(ftrl **)(plVar2 + 0xb8) = pfVar1;
  *(code **)(plVar2 + 200) = noop;
  *(code **)(plVar2 + 0x50) = noop_sensitivity;
  *(ftrl **)(plVar2 + 0x58) = pfVar1;
  *(code **)(plVar2 + 0x68) = return_simple_example;
  *(ftrl **)(plVar2 + 0x18) = pfVar1;
  *(_func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr **)(plVar2 + 0x28) = learn;
  *(_func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr **)(plVar2 + 0x38) = learn;
  *(_func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr **)(plVar2 + 0x30) = predict;
  *(undefined8 *)(plVar2 + 0x40) = 0;
  *(undefined4 *)(plVar2 + 0xd0) = 0;
  plVar2[0xe8] = (learner<ftrl,_example>)0x0;
  (dat->_M_t).super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>._M_head_impl
       = (ftrl *)0x0;
  return plVar2;
}

Assistant:

learner<T, E>& init_learner(
    free_ptr<T>& dat, void (*learn)(T&, L&, E&), void (*predict)(T&, L&, E&), size_t params_per_weight)
{
  auto ret =
      &learner<T, E>::init_learner(dat.get(), (L*)nullptr, learn, predict, params_per_weight, prediction_type::scalar);

  dat.release();
  return *ret;
}